

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.cpp
# Opt level: O3

uint8_t __thiscall
GmmLib::PageTable::GetMappingType
          (PageTable *this,GMM_GFX_ADDRESS GfxVA,GMM_GFX_SIZE_T Size,GMM_GFX_ADDRESS *LastAddr)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ulong uVar4;
  undefined4 extraout_var_06;
  ulong uVar5;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  LastLevelTable *pLVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  uint local_90;
  uint local_88;
  long local_40;
  
  iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
  uVar6 = 1;
  if ((*(byte *)(CONCAT44(extraout_var,iVar2) + 0x45) & 0x40) == 0) {
    iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
    uVar6 = 4;
    if ((*(byte *)(CONCAT44(extraout_var_00,iVar2) + 0x45) & 0x80) == 0) {
      uVar6 = 0x40;
    }
  }
  iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
  local_40 = 0x4000;
  if ((*(byte *)(CONCAT44(extraout_var_01,iVar2) + 0x45) & 0x40) == 0) {
    iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
    local_40 = 0x10000;
    if ((*(byte *)(CONCAT44(extraout_var_02,iVar2) + 0x45) & 0x80) == 0) {
      local_40 = 0x100000;
    }
  }
  pthread_mutex_lock((pthread_mutex_t *)&this->TTLock);
  uVar11 = GfxVA;
  if (Size + GfxVA <= GfxVA) {
    bVar14 = false;
LAB_001b8ebf:
    *LastAddr = uVar11;
    pthread_mutex_unlock((pthread_mutex_t *)&this->TTLock);
    return bVar14;
  }
  uVar13 = (ulong)(ushort)(((uint)(GfxVA >> 0xe) & 0x3ff) / (uint)uVar6);
  uVar8 = GfxVA >> 0x24 & 0xfff;
  uVar10 = GfxVA >> 0x18 & 0xfff;
  bVar14 = false;
LAB_001b8ba7:
  if (this->pTTL2[uVar8].super_Table.PoolElem == (GMM_PAGETABLEPool *)0x0) {
    if (bVar14 == false) {
      iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
      uVar3 = *(uint *)(CONCAT44(extraout_var_03,iVar2) + 0x44);
      uVar6 = 1;
      if (uVar11 == GfxVA) {
        if ((uVar3 >> 0xe & 1) == 0) {
          iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
          uVar6 = 4;
          if ((*(byte *)(CONCAT44(extraout_var_04,iVar2) + 0x45) & 0x80) == 0) {
            uVar6 = 0x40;
          }
        }
        uVar13 = (ulong)(0x1000 - (int)uVar10) * (ulong)(0x400 / uVar6 - (uint)uVar13);
      }
      else {
        if ((uVar3 >> 0xe & 1) == 0) {
          iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
          uVar6 = 4;
          if ((*(byte *)(CONCAT44(extraout_var_09,iVar2) + 0x45) & 0x80) == 0) {
            uVar6 = 0x40;
          }
        }
        uVar13 = (ulong)(0x400 / uVar6 << 0xc);
      }
      uVar11 = uVar11 + uVar13 * local_40;
      uVar8 = uVar8 + 1;
      bVar15 = uVar8 == 0x1000;
      bVar14 = false;
      uVar10 = 0;
      goto LAB_001b8e54;
    }
LAB_001b8ebc:
    bVar14 = true;
    goto LAB_001b8ebf;
  }
  for (pLVar9 = this->pTTL2[uVar8].pTTL1; pLVar9 != (LastLevelTable *)0x0; pLVar9 = pLVar9->pNext) {
    if (uVar10 == (long)(int)pLVar9->L2eIdx) {
      if ((pLVar9->super_Table).PoolElem != (GMM_PAGETABLEPool *)0x0) {
        uVar3 = (uint)uVar13 & 0x1f;
        uVar12 = uVar13 >> 5;
        iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
        uVar4 = 0x20;
        if ((*(byte *)(CONCAT44(extraout_var_05,iVar2) + 0x45) & 0x40) == 0) {
          uVar4 = 8;
        }
        if (uVar4 <= uVar12) goto LAB_001b8e71;
        goto LAB_001b8cd2;
      }
      break;
    }
  }
  if (bVar14 != false) goto LAB_001b8ebc;
  iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
  uVar6 = 1;
  if ((*(byte *)(CONCAT44(extraout_var_07,iVar2) + 0x45) & 0x40) == 0) {
    iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
    uVar6 = 4;
    if ((*(byte *)(CONCAT44(extraout_var_08,iVar2) + 0x45) & 0x80) == 0) {
      uVar6 = 0x40;
    }
  }
  if (uVar11 != GfxVA) {
    uVar13 = 0;
  }
  uVar11 = uVar11 + (0x400 / uVar6 - uVar13) * local_40;
  uVar10 = uVar10 + 1;
  if (uVar10 == 0x1000) {
    uVar8 = uVar8 + 1;
    bVar15 = uVar8 == 0x1000;
    uVar10 = 0;
  }
  else {
    bVar15 = false;
  }
  bVar14 = false;
LAB_001b8e54:
  if ((bVar15) || (uVar13 = 0, Size + GfxVA <= uVar11)) goto LAB_001b8ebf;
  goto LAB_001b8ba7;
  while( true ) {
    iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
    uVar5 = 8;
    if ((*(byte *)(CONCAT44(extraout_var_06,iVar2) + 0x45) & 0x40) != 0) {
      uVar5 = 0x20;
    }
    uVar12 = uVar12 + 1;
    uVar11 = uVar11 + uVar4 * local_40;
    if (uVar5 <= uVar12) break;
LAB_001b8cd2:
    uVar1 = (pLVar9->super_Table).UsedEntries[uVar12];
    if (uVar11 == GfxVA) {
      local_90 = (uint)(1L << ((byte)uVar13 & 0x1f));
      bVar14 = (local_90 & uVar1) != 0;
      local_88 = (uint)(-1L << (char)uVar3 + 1);
      local_88 = (-(uint)bVar14 ^ uVar1) & local_88;
      uVar4 = (ulong)(0x20 - uVar3);
      uVar7 = uVar3;
    }
    else {
      uVar7 = 0;
      local_88 = -(uint)(bVar14 != false) ^ uVar1;
      uVar4 = 0x20;
    }
    if (local_88 != 0) {
      iVar2 = 0;
      if (local_88 != 0) {
        for (; (local_88 >> iVar2 & 1) == 0; iVar2 = iVar2 + 1) {
        }
      }
      uVar11 = uVar11 + local_40 * (ulong)(iVar2 - uVar7);
      goto LAB_001b8ebf;
    }
  }
LAB_001b8e71:
  uVar10 = uVar10 + 1;
  if (uVar10 == 0x1000) {
    uVar8 = uVar8 + 1;
    bVar15 = uVar8 == 0x1000;
    uVar10 = 0;
  }
  else {
    bVar15 = false;
  }
  goto LAB_001b8e54;
}

Assistant:

uint8_t GmmLib::PageTable::GetMappingType(GMM_GFX_ADDRESS GfxVA, GMM_GFX_SIZE_T Size, GMM_GFX_ADDRESS &LastAddr)
{
    GMM_GFX_SIZE_T  L3eIdx, L2eIdx, L1eIdx, L1EntrySize;
    uint32_t        L1Size, L2Size;
    uint8_t         MapType      = 0; //true for non-null, false for null mapped
    bool            bFoundLastVA = false, bTerminate = false;
    GMM_GFX_ADDRESS TileAddr = GfxVA;

    L3eIdx      = GMM_L3_ENTRY_IDX(TTType, GfxVA);
    L2eIdx      = GMM_L2_ENTRY_IDX(TTType, GfxVA);
    L1eIdx      = GMM_L1_ENTRY_IDX(TTType, GfxVA, GetGmmLibContext());
    L1EntrySize = WA16K(GetGmmLibContext()) ? GMM_KBYTE(16) : WA64K(GetGmmLibContext()) ? GMM_KBYTE(64) : GMM_MBYTE(1);

    EnterCriticalSection(&TTLock);
    __GMM_ASSERT(TTL3.L3Handle);

#define GET_NEXT_L1TABLE(L1eIdx, L2eIdx, L3eIdx) \
    {                                            \
        L1eIdx = 0;                              \
        L2eIdx++;                                \
        if(L2eIdx == (GMM_L2_SIZE(TTType)))      \
        {                                        \
            L2eIdx = 0;                          \
            L3eIdx++;                            \
            if(L3eIdx == (GMM_L3_SIZE(TTType)))  \
            {                                    \
                bTerminate = true;               \
            }                                    \
        }                                        \
    }

#define GET_NEXT_L2TABLE(L1eIdx, L2eIdx, L3eIdx) \
    {                                            \
        L1eIdx = L2eIdx = 0;                     \
        L3eIdx++;                                \
        if(L3eIdx == (GMM_L3_SIZE(TTType)))      \
        {                                        \
            bTerminate = true;                   \
        }                                        \
    }

    while(!(bFoundLastVA || bTerminate) && (TileAddr < GfxVA + Size))
    {
        if(pTTL2[L3eIdx].GetPool())
        {
            GmmLib::LastLevelTable *pL1Tbl = NULL;
            pL1Tbl                         = pTTL2[L3eIdx].GetL1Table(L2eIdx);
            if(pL1Tbl && pL1Tbl->GetPool())
            {
                uint32_t LastBit = 0;
                uint32_t i       = static_cast<uint32_t>(L1eIdx) / 32;

                while(!bFoundLastVA && i < (uint32_t)(GMM_L1_SIZE_DWORD(TTType, GetGmmLibContext())))
                {
                    uint32_t UsageDW = pL1Tbl->GetUsedEntries()[i++];
                    uint32_t BitNum  = 31;
                    if(GfxVA == TileAddr)
                    {
                        BitNum  = L1eIdx % 32;
                        MapType = ((UsageDW & __BIT(BitNum)) ? 0x1 : 0x0); //true for non-null, false for null mapped
                        UsageDW = (!MapType) ? UsageDW : ~UsageDW;
                        UsageDW = ((uint64_t)UsageDW >> (BitNum + 1)) << (BitNum + 1); // clear lsb <= BitNum
                    }
                    else
                    {
                        UsageDW = (!MapType) ? UsageDW : ~UsageDW;
                    }

                    if(_BitScanForward((uint32_t *)&LastBit, UsageDW)) // Gets lsb > BitNum, having reverse mapType
                    {
                        bFoundLastVA      = true;
                        uint32_t NumTiles = (GfxVA == TileAddr) ? (LastBit - BitNum) : LastBit;
                        LastAddr          = TileAddr + NumTiles * L1EntrySize;
                    }
                    else
                    {
                        uint32_t NumTiles = (GfxVA == TileAddr) ? (32 - BitNum) : 32;
                        TileAddr += NumTiles * L1EntrySize;
                    }
                }
                if(!bFoundLastVA)
                {
                    GET_NEXT_L1TABLE(L1eIdx, L2eIdx, L3eIdx);
                }
            }
            else //L2Entry is NULL
            {
                if(MapType) //First hit null-map
                {
                    LastAddr     = TileAddr;
                    bFoundLastVA = true;
                }
                else
                {
                    GMM_GFX_SIZE_T NumTiles = GMM_L1_USABLESIZE(TTType, GetGmmLibContext());			
                    if(GfxVA == TileAddr)
                    {
                        MapType = false;
                        NumTiles -= L1eIdx;
                    }
                    TileAddr += NumTiles * L1EntrySize;
                    GET_NEXT_L1TABLE(L1eIdx, L2eIdx, L3eIdx)
                }
            }
        }
        else //L3entry is NULL
        {
            if(MapType) //First hit null-map
            {
                LastAddr     = TileAddr;
                bFoundLastVA = true;
            }
            else
            {
                GMM_GFX_SIZE_T NumTiles = 0;
                if(GfxVA == TileAddr)
                {
                    MapType  = false;
                    L1Size   = GMM_L1_USABLESIZE(TTType, GetGmmLibContext()) - L1eIdx;
                    L2Size   = GMM_L2_SIZE(TTType) - L2eIdx;
                    NumTiles = ((uint64_t)L1Size * L2Size);
                }
                else
                {
                    L1Size   = GMM_L1_USABLESIZE(TTType, GetGmmLibContext());
                    L2Size   = GMM_L2_SIZE(TTType);
                    NumTiles = ((uint64_t)L1Size * L2Size);
                }
                TileAddr += NumTiles * L1EntrySize;
                GET_NEXT_L2TABLE(L1eIdx, L2eIdx, L3eIdx)
            }
        }
    }

    if(!bFoundLastVA)
    {
        LastAddr = TileAddr;
    }

    LeaveCriticalSection(&TTLock);
    return MapType;
}